

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_eq_exp(SyntaxAnalyze *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SyntaxAnalyze *in_RDI;
  SharedExNdPtr SVar5;
  string tmpName;
  Op op;
  SharedExNdPtr father;
  SharedExNdPtr second;
  SharedExNdPtr *first;
  ExpressNode *in_stack_fffffffffffffe58;
  element_type *in_stack_fffffffffffffe60;
  undefined1 *in_stack_fffffffffffffe68;
  SyntaxAnalyze *in_stack_fffffffffffffe70;
  undefined1 *in_stack_fffffffffffffe78;
  SyntaxAnalyze *in_stack_fffffffffffffe80;
  undefined1 local_110 [16];
  undefined1 local_100 [32];
  undefined1 local_e0 [48];
  string local_b0 [4];
  Op in_stack_ffffffffffffff54;
  SharedExNdPtr *in_stack_ffffffffffffff58;
  SharedExNdPtr *in_stack_ffffffffffffff60;
  __node_base in_stack_ffffffffffffff68;
  SyntaxAnalyze *in_stack_ffffffffffffff70;
  Token in_stack_ffffffffffffffcc;
  SyntaxAnalyze *in_stack_ffffffffffffffd0;
  TyKind in_stack_ffffffffffffffe4;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar6;
  SyntaxAnalyze *this_00;
  
  uVar6 = 0;
  this_00 = in_RDI;
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2af257);
  gm_rel_exp(this_00);
  std::shared_ptr<front::express::ExpressNode>::operator=
            ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
             (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe58);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2af290);
  while (bVar3 = try_word(in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                          (Token)in_stack_fffffffffffffe78,
                          (Token)((ulong)in_stack_fffffffffffffe70 >> 0x20)), bVar3) {
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2af2cc);
    operator_new(0x48);
    express::ExpressNode::ExpressNode((ExpressNode *)in_stack_fffffffffffffe80);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe58);
    bVar3 = try_word(in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     (Token)in_stack_fffffffffffffe68);
    if (bVar3) {
      match_one_word(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      peVar4 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2af348);
      peVar4->_operation = EQL;
    }
    else {
      match_one_word(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      peVar4 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2af3f3);
      peVar4->_operation = NEQ;
    }
    gm_rel_exp(this_00);
    std::shared_ptr<front::express::ExpressNode>::operator=
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe58);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2af43e);
    peVar4 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2af44b);
    if ((peVar4->_type == CNS) &&
       (peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2af461), peVar4->_type == CNS)) {
      peVar4 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2af47c);
      peVar4->_type = CNS;
      peVar4 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2af48c);
      if (peVar4->_operation == EQL) {
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2af4b5);
        iVar2 = peVar4->_value;
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2af4c9);
        iVar1 = peVar4->_value;
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2af4ec);
        peVar4->_value = (uint)(iVar2 == iVar1);
      }
      else if (peVar4->_operation == NEQ) {
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2af502);
        iVar2 = peVar4->_value;
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2af516);
        iVar1 = peVar4->_value;
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2af539);
        peVar4->_value = (uint)(iVar2 != iVar1);
      }
    }
    else {
      std::__cxx11::string::string((string *)&stack0xffffffffffffff70);
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                ((irGenerator *)CONCAT17(uVar6,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4)
      ;
      std::__cxx11::string::operator=((string *)&stack0xffffffffffffff70,local_b0);
      std::__cxx11::string::~string(local_b0);
      peVar4 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2af5ae);
      peVar4->_type = VAR;
      peVar4 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2af5be);
      std::__cxx11::string::operator=((string *)&peVar4->_name,(string *)&stack0xffffffffffffff70);
      std::__cxx11::string::string((string *)(local_e0 + 0x10),(string *)&stack0xffffffffffffff70);
      in_stack_fffffffffffffe80 = (SyntaxAnalyze *)local_e0;
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe58);
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe58);
      hp_gn_binary_mir(in_stack_ffffffffffffff70,(string *)in_stack_ffffffffffffff68._M_nxt,
                       in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54
                      );
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2af652);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2af65f);
      std::__cxx11::string::~string((string *)(local_e0 + 0x10));
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    }
    in_stack_fffffffffffffe70 =
         (SyntaxAnalyze *)
         std::
         __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2af6eb);
    in_stack_fffffffffffffe78 = local_100;
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe58);
    express::ExpressNode::addChild
              (in_stack_fffffffffffffe60,(SharedExNdPtr *)in_stack_fffffffffffffe58);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2af728);
    in_stack_fffffffffffffe60 =
         std::
         __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2af735);
    in_stack_fffffffffffffe68 = local_110;
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe58);
    express::ExpressNode::addChild
              (in_stack_fffffffffffffe60,(SharedExNdPtr *)in_stack_fffffffffffffe58);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2af772);
    std::shared_ptr<front::express::ExpressNode>::operator=
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe60,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe58);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2af794);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2af7a1);
  }
  SVar5.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  SVar5.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (SharedExNdPtr)
         SVar5.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_eq_exp() {
  SharedExNdPtr first;
  first = gm_rel_exp();

  while (try_word(1, Token::EQL, Token::NEQ)) {
    SharedExNdPtr second;
    SharedExNdPtr father(new ExpressNode());
    Op op;

    if (try_word(1, Token::EQL)) {
      match_one_word(Token::EQL);
      father->_operation = OperationType::EQL;
      op = Op::Eq;
    } else {
      match_one_word(Token::NEQ);
      father->_operation = OperationType::NEQ;
      op = Op::Neq;
    }

    second = gm_rel_exp();

    if (first->_type == NodeType::CNS && second->_type == NodeType::CNS) {
      father->_type = NodeType::CNS;
      switch (father->_operation) {
        case OperationType::EQL:
          father->_value = first->_value == second->_value;
          break;
        case OperationType::NEQ:
          father->_value = first->_value != second->_value;
          break;
        default:
          break;
      }
    } else {
      string tmpName;

      tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
      father->_type = NodeType::VAR;
      father->_name = tmpName;

      hp_gn_binary_mir(tmpName, first, second, op);
    }

    father->addChild(first);
    father->addChild(second);
    first = father;
  }
  return first;
}